

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringSubstrMethod::StringSubstrMethod
          (StringSubstrMethod *this,Compilation *comp)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_5a;
  allocator<char> local_59;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_58;
  string local_40;
  Type *local_20;
  Type *local_18;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"substr",&local_59);
  local_20 = comp->intType;
  __l._M_len = 2;
  __l._M_array = &local_20;
  local_18 = local_20;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_58,__l,&local_5a);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,&local_40,Function,2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_58,comp->stringType,true,false);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_00477120;
  return;
}

Assistant:

explicit StringSubstrMethod(Compilation& comp) :
        SimpleSystemSubroutine("substr", SubroutineKind::Function, 2,
                               {&comp.getIntType(), &comp.getIntType()}, comp.getStringType(),
                               true) {}